

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_fragment_shading_rate
          (Impl *this,Value *state,VkPipelineFragmentShadingRateStateCreateInfoKHR **out_info)

{
  undefined8 uVar1;
  Number in_RAX;
  VkPipelineFragmentShadingRateStateCreateInfoKHR *pVVar2;
  Number NVar3;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar4;
  Type pGVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar6;
  uint32_t i;
  long lVar7;
  undefined8 local_28;
  
  local_28 = in_RAX;
  pVVar2 = (VkPipelineFragmentShadingRateStateCreateInfoKHR *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar2 != (VkPipelineFragmentShadingRateStateCreateInfoKHR *)0x0) {
    (pVVar2->fragmentSize).width = 0;
    (pVVar2->fragmentSize).height = 0;
    pVVar2->combinerOps[0] = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_KEEP_KHR;
    pVVar2->combinerOps[1] = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_KEEP_KHR;
    *(undefined8 *)pVVar2 = 0;
    pVVar2->pNext = (void *)0x0;
  }
  *out_info = pVVar2;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffd8,(Ch *)state);
  uVar1 = local_28;
  NVar3.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (uVar1 != NVar3.i64) {
    pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)state,"fragmentSize");
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar4,"width");
    if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      (pVVar2->fragmentSize).width = (pGVar5->data_).s.length;
      pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)state,"fragmentSize");
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(pGVar4,"height");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        (pVVar2->fragmentSize).height = (pGVar5->data_).s.length;
        goto LAB_00158d2d;
      }
    }
LAB_00158d96:
    __assert_fail("data_.f.flags & kUintFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x719,
                  "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
LAB_00158d2d:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffd8,(Ch *)state);
  NVar3.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (local_28 != NVar3.i64) {
    lVar7 = 0;
    do {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"combinerOps");
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator[](pGVar5,(SizeType)lVar7);
      if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_00158d96;
      pVVar2->combinerOps[lVar7] = (pGVar6->data_).s.length;
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_fragment_shading_rate(const Value &state,
                                                      VkPipelineFragmentShadingRateStateCreateInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineFragmentShadingRateStateCreateInfoKHR>();
	*out_info = info;

	// Could be null for dynamic state.
	if (state.HasMember("fragmentSize"))
	{
		info->fragmentSize.width = state["fragmentSize"]["width"].GetUint();
		info->fragmentSize.height = state["fragmentSize"]["height"].GetUint();
	}

	// Could be null for dynamic state.
	if (state.HasMember("combinerOps"))
	{
		for (uint32_t i = 0; i < 2; i++)
			info->combinerOps[i] = static_cast<VkFragmentShadingRateCombinerOpKHR>(state["combinerOps"][i].GetUint());
	}

	return true;
}